

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.cpp
# Opt level: O3

Task * AI::create_ChaseLastKnownHeading(void)

{
  iterator __position;
  pointer pTVar1;
  pointer pRVar2;
  Task *in_RDI;
  Task moveAlongHeading;
  Task stopMoving;
  string local_770;
  string local_750;
  string local_730;
  undefined1 local_710 [120];
  vector<ConsumableFact,_std::allocator<ConsumableFact>_> local_698 [3];
  vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>
  local_650 [18];
  Action local_4a0;
  _Any_data local_498;
  pointer local_488;
  pointer local_480;
  _Any_data local_478;
  pointer local_468;
  pointer local_460;
  vector<Math::Vector3,_std::allocator<Math::Vector3>_> local_3f0;
  vector<float,_std::allocator<float>_> local_3d8 [2];
  Task local_398;
  
  local_730._M_dataplus._M_p = (pointer)&local_730.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_730,"chaseHeading","");
  Task::Task(in_RDI,&local_730,Compound);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_730._M_dataplus._M_p != &local_730.field_2) {
    operator_delete(local_730._M_dataplus._M_p,local_730.field_2._M_allocated_capacity + 1);
  }
  in_RDI->identifier = ChaseLastKnownHeading;
  local_710._0_4_ = Boredom;
  __position._M_current =
       (in_RDI->preconditions).consumableVectors.
       super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (in_RDI->preconditions).consumableVectors.
      super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::_M_realloc_insert<ConsumableFact>
              (&(in_RDI->preconditions).consumableVectors,__position,(ConsumableFact *)local_710);
  }
  else {
    *__position._M_current = Player_ForwardVector;
    (in_RDI->preconditions).consumableVectors.
    super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  local_710._0_4_ = PlayerIdentified;
  local_710[4] = false;
  std::vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>::emplace_back<AI::RequiredFlag>
            ((vector<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_> *)in_RDI,
             (RequiredFlag *)local_710);
  local_750._M_dataplus._M_p = (pointer)&local_750.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_750,"moveAlongHeading","");
  Task::Task((Task *)local_710,&local_750,Simple);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_750._M_dataplus._M_p != &local_750.field_2) {
    operator_delete(local_750._M_dataplus._M_p,local_750.field_2._M_allocated_capacity + 1);
  }
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x43a00000;
  if (local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_finish ==
      local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (local_3d8,
               (iterator)
               local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_398);
  }
  else {
    *local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = 320.0;
    local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_398.preconditions.requiredFlags.
                         super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x447a0000);
  if (local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_finish ==
      local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (local_3d8,
               (iterator)
               local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_398);
  }
  else {
    *local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1000.0;
    local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_3d8[0].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)CONCAT44(local_398.preconditions.requiredFlags.
                         super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>.
                         _M_impl.super__Vector_impl_data._M_finish._4_4_,0x3f800000);
  if (local_3f0.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_3f0.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Math::Vector3,_std::allocator<Math::Vector3>_>::_M_realloc_insert<Math::Vector3>
              (&local_3f0,
               (iterator)
               local_3f0.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
               super__Vector_impl_data._M_finish,(Vector3 *)&local_398);
  }
  else {
    (local_3f0.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
     super__Vector_impl_data._M_finish)->z = 1.0;
    (local_3f0.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = 0.0;
    (local_3f0.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = 0.0;
    local_3f0.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_3f0.super__Vector_base<Math::Vector3,_std::allocator<Math::Vector3>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_398.preconditions.requiredFlags.
                         super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,1);
  if (local_698[0].super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_698[0].super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<ConsumableFact,_std::allocator<ConsumableFact>_>::_M_realloc_insert<ConsumableFact>
              (local_698,
               (iterator)
               local_698[0].super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>.
               _M_impl.super__Vector_impl_data._M_finish,(ConsumableFact *)&local_398);
  }
  else {
    *local_698[0].super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
     super__Vector_impl_data._M_finish = Player_ForwardVector;
    local_698[0].super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_698[0].super__Vector_base<ConsumableFact,_std::allocator<ConsumableFact>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  pRVar2 = local_488;
  local_4a0 = MoveToDestination;
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_498._M_unused._0_8_;
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_498._8_8_;
  local_498._M_unused._M_object = (void *)0x0;
  local_498._8_8_ = 0;
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_488;
  local_488 = (pointer)std::
                       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:368:28)>
                       ::_M_manager;
  local_398.preconditions.requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start = local_480;
  local_480 = (pointer)std::
                       _Function_handler<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:368:28)>
                       ::_M_invoke;
  if (pRVar2 != (pointer)0x0) {
    (*(code *)pRVar2)(&local_398,&local_398,3);
  }
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xffffffff00000001;
  std::vector<AI::SatisfiablePredicateParams,_std::allocator<AI::SatisfiablePredicateParams>_>::
  emplace_back<AI::SatisfiablePredicateParams>(local_650,(SatisfiablePredicateParams *)&local_398);
  pRVar2 = local_468;
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_478._M_unused._0_8_;
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_478._8_8_;
  local_478._M_unused._M_object = (void *)0x0;
  local_478._8_8_ = 0;
  local_398.preconditions.requiredFlags.
  super__Vector_base<AI::RequiredFlag,_std::allocator<AI::RequiredFlag>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_468;
  local_468 = (pointer)std::
                       _Function_handler<void_(AI::WorldState_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:378:29)>
                       ::_M_manager;
  local_398.preconditions.requiredValues.
  super__Vector_base<AI::RequiredValue,_std::allocator<AI::RequiredValue>_>._M_impl.
  super__Vector_impl_data._M_start = local_460;
  local_460 = (pointer)std::
                       _Function_handler<void_(AI::WorldState_&,_AI::Task_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/patrick-lafferty[P]aitu/Tasks.cpp:378:29)>
                       ::_M_invoke;
  if (pRVar2 != (pointer)0x0) {
    (*(code *)pRVar2)(&local_398,&local_398,3);
  }
  local_770._M_dataplus._M_p = (pointer)&local_770.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_770,"stopMoving","");
  Task::Task(&local_398,&local_770,Simple);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_770._M_dataplus._M_p != &local_770.field_2) {
    operator_delete(local_770._M_dataplus._M_p,local_770.field_2._M_allocated_capacity + 1);
  }
  local_398.action = StopMoving;
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
      super__Vector_impl_data._M_start != pTVar1) {
    pTVar1[-1].isLastInCompound = false;
  }
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back
            (&in_RDI->subtasks,(value_type *)local_710);
  pTVar1 = (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar1[-1].isLastInCompound =
       (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
       super__Vector_impl_data._M_start == pTVar1;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::push_back(&in_RDI->subtasks,&local_398);
  (in_RDI->subtasks).super__Vector_base<AI::Task,_std::allocator<AI::Task>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].isLastInCompound = true;
  Task::~Task(&local_398);
  Task::~Task((Task *)local_710);
  return in_RDI;
}

Assistant:

Task create_ChaseLastKnownHeading()
	{
		/*
		1 - move to last known location
		2 - move X distance along heading
		*/

		Task chaseHeading {"chaseHeading", TaskType::Compound};
		chaseHeading.identifier = TaskIdentifier::ChaseLastKnownHeading;
		chaseHeading.preconditions.consumableVectors.push_back(ConsumableFact::Player_ForwardVector);
		chaseHeading.preconditions.requiredFlags.push_back({WorldStateIdentifier::PlayerIdentified, false});

		Task moveAlongHeading {"moveAlongHeading"};
		//amount to move along heading
		//note: should change based when alt paths appear, such as hallway with other paths 
		moveAlongHeading.parameters.values.push_back(320);
		moveAlongHeading.parameters.values.push_back(1000);
		moveAlongHeading.parameters.vectors.push_back({0.f, 0.f, 1.f});
		moveAlongHeading.preconditions.consumableVectors.push_back(ConsumableFact::Player_ForwardVector);
		moveAlongHeading.action = Action::MoveToDestination;		
		moveAlongHeading.setup = [=](Task& task, WorldState& state, const WorldQuerier&)
		{
			auto& currentPosition = state.current.vectors[WorldStateIdentifier::CurrentPosition];
			auto playerForwardVector = state.facts.vectors[ConsumableFact::Player_ForwardVector].value;

			auto destination = currentPosition + playerForwardVector * task.parameters.values[1];
			state.current.vectors[WorldStateIdentifier::Destination] = destination;
		};

		moveAlongHeading.postconditions.satisfiedPredicates.push_back({SatisfiablePredicateIdentifier::NearDestination, -1});
		moveAlongHeading.finish = [](WorldState& state, Task& task)
		{
			state.consumeFactVector(ConsumableFact::Player_ForwardVector);
		};

		Task stopMoving {"stopMoving"};
		stopMoving.action = Action::StopMoving;

		chaseHeading.addSubtask(moveAlongHeading);
		chaseHeading.addSubtask(stopMoving);		

		return chaseHeading;
	}